

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

size_t __thiscall
cappuccino::tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_long,std::__cxx11::string>>>>
          (tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)0> *this,
          vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *key_value_range,allow a)

{
  pointer ptVar1;
  bool bVar2;
  time_point now;
  size_t sVar3;
  _Head_base<1UL,_unsigned_long,_false> *key;
  pointer ptVar4;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  ptVar4 = (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar4 == ptVar1) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    key = &(ptVar4->
           super__Tuple_impl<0UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Head_base<1UL,_unsigned_long,_false>;
    do {
      bVar2 = tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
              ::do_insert_update((tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
                                  *)this,&key->_M_head_impl,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(key + -4),now,
                                 (time_point)(*(long *)(key + 1) * 1000000 + (long)now.__d.__r),a);
      sVar3 = sVar3 + bVar2;
      ptVar4 = (pointer)(key + 2);
      key = key + 6;
    } while (ptVar4 != ptVar1);
  }
  return sVar3;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now = std::chrono::steady_clock::now();
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [ttl, key, value] : key_value_range)
            {
                auto expired_time = now + ttl;
                if (do_insert_update(key, std::move(value), now, expired_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }